

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O2

size_t __thiscall
merlin::graphical_model::induced_width(graphical_model *this,variable_order_t *order)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  unsigned_long uVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  size_t i_1;
  size_t sVar6;
  size_t i;
  ulong uVar7;
  size_t n;
  pointer pvVar8;
  pointer peVar9;
  long lVar10;
  ulong local_1a8;
  size_t j;
  vector<unsigned_long,_std::allocator<unsigned_long>_> position;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> S;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> adj;
  my_set<merlin::edge_id> ns;
  graph g;
  
  mrf(&adj,this);
  n = (long)(order->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(order->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3;
  graph::graph(&g,n);
  for (uVar7 = 0;
      uVar7 < (ulong)(((long)adj.
                             super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)adj.
                            super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x38); uVar7 = uVar7 + 1) {
    pvVar8 = adj.super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
             _M_impl.super__Vector_impl_data._M_start + uVar7;
    for (lVar10 = 0;
        puVar2 = (pvVar8->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        lVar10 != (long)(pvVar8->m_v).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2 >> 3; lVar10 = lVar10 + 1)
    {
      graph::add_edge(&g,uVar7,puVar2[lVar10]);
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&position,n,(allocator_type *)&S);
  puVar2 = (order->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (sVar6 = 0; n != sVar6; sVar6 = sVar6 + 1) {
    position.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[puVar2[sVar6]] = sVar6;
  }
  p_Var1 = &S._M_t._M_impl.super__Rb_tree_header;
  local_1a8 = 0;
  for (sVar6 = 0; sVar6 != n; sVar6 = sVar6 + 1) {
    uVar3 = (order->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[sVar6];
    uVar7 = position.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar3];
    my_set<merlin::edge_id>::my_set
              (&ns,g.m_adj.
                   super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar3);
    S._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    S._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    S._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    peVar9 = ns.super_my_vector<merlin::edge_id>.
             super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
             super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
             super__Vector_impl_data._M_start;
    S._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    S._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    for (; peVar9 != ns.super_my_vector<merlin::edge_id>.
                     super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                     super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                     super__Vector_impl_data._M_finish; peVar9 = peVar9 + 1) {
      j = peVar9->second;
      if (uVar7 < position.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[j]) {
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)&S,&j);
      }
    }
    p_Var5 = S._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_1a8 <= S._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      local_1a8 = S._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    for (; p_Var4 = p_Var5, (_Rb_tree_header *)p_Var5 != p_Var1;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      while (p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4),
            (_Rb_tree_header *)p_Var4 != p_Var1) {
        if (*(index *)(p_Var5 + 1) != *(index *)(p_Var4 + 1)) {
          graph::add_edge(&g,*(index *)(p_Var5 + 1),*(index *)(p_Var4 + 1));
        }
      }
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)&S);
    std::_Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>::~_Vector_base
              ((_Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_> *)&ns);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&position.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  graph::~graph(&g);
  std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector(&adj);
  return local_1a8;
}

Assistant:

size_t induced_width(const variable_order_t& order) const {
		//return pseudo_tree_size(order).first;

		size_t width = 0;
		std::vector<variable_set> adj = mrf();
		size_t n = order.size();
		graph g(n); // create the graph
		for (size_t i = 0; i < adj.size(); ++i) {
			const variable_set& vi = adj[i];
			for (variable_set::const_iterator cj = vi.begin();
					cj != vi.end(); ++cj) {
				size_t j = _vindex(*cj);
				g.add_edge(i, j);
			}
		}

		std::vector<size_t> position(n);
		for (size_t i = 0; i < n; ++i) {
			position[order[i]] = i;
		}

		// eliminate variables and create induced edges
		for (size_t i = 0; i < n; ++i) {
			size_t var = order[i];
			size_t pos = position[var];

			// find the neighbors appearing later in the ordering
			const my_set<edge_id> ns = g.neighbors(var);
			std::set<size_t> S;
			for (my_set<edge_id>::const_iterator si = ns.begin();
					si != ns.end(); ++si) {
				size_t j = si->second;
				if (position[j] > pos) {
					S.insert(j);
				}
			}

			// connect the neighbors appearing later in the ordering
			width = std::max(width, S.size());
			std::set<size_t>::iterator it1, it2;
			for (it1 = S.begin(); it1 != S.end(); ++it1) {
				it2 = it1;
				while (++it2 != S.end()) {
					size_t u = *it1, v = *it2;
					if (u != v) g.add_edge(u, v);
				}
			}
		}

		return width;
	}